

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::sectionEndedEarly(RunContext *this,SectionEndInfo *endInfo)

{
  bool bVar1;
  reference ppIVar2;
  SectionEndInfo *endInfo_local;
  RunContext *this_local;
  
  bVar1 = std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::empty
                    (&this->m_unfinishedSections);
  if (bVar1) {
    ppIVar2 = std::
              vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
              ::back(&this->m_activeSections);
    (*((*ppIVar2)->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[0xb])();
  }
  else {
    ppIVar2 = std::
              vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
              ::back(&this->m_activeSections);
    (*((*ppIVar2)->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[10])();
  }
  std::
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::pop_back(&this->m_activeSections);
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::push_back
            (&this->m_unfinishedSections,endInfo);
  return;
}

Assistant:

virtual void sectionEndedEarly( SectionEndInfo const& endInfo ) {
            if( m_unfinishedSections.empty() )
                m_activeSections.back()->fail();
            else
                m_activeSections.back()->close();
            m_activeSections.pop_back();

            m_unfinishedSections.push_back( endInfo );
        }